

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

uchar * CompressData(uchar *data,int dataLength,int *compDataLength)

{
  int iVar1;
  uchar *out;
  sdefl sdefl;
  
  memset(&sdefl,0,0xc0b54);
  iVar1 = sdefl_bound(dataLength);
  out = (uchar *)calloc((long)iVar1,1);
  iVar1 = sdeflate(&sdefl,out,data,dataLength,8);
  *compDataLength = iVar1;
  TraceLog(3,"SYSTEM: Compress data: Original size: %i -> Comp. size: %i",dataLength,compDataLength)
  ;
  return out;
}

Assistant:

unsigned char *CompressData(unsigned char *data, int dataLength, int *compDataLength)
{
    #define COMPRESSION_QUALITY_DEFLATE  8

    unsigned char *compData = NULL;

#if defined(SUPPORT_COMPRESSION_API)
    // Compress data and generate a valid DEFLATE stream
    struct sdefl sdefl = { 0 };
    int bounds = sdefl_bound(dataLength);
    compData = (unsigned char *)RL_CALLOC(bounds, 1);
    *compDataLength = sdeflate(&sdefl, compData, data, dataLength, COMPRESSION_QUALITY_DEFLATE);   // Compression level 8, same as stbwi

    TraceLog(LOG_INFO, "SYSTEM: Compress data: Original size: %i -> Comp. size: %i", dataLength, compDataLength);
#endif

    return compData;
}